

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<8,_1,_false,_embree::avx::SubGridIntersector1Moeller<8,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  RTCIntersectArguments *pRVar9;
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined4 uVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  uint uVar89;
  ulong uVar90;
  long lVar91;
  long lVar92;
  ulong uVar93;
  ulong uVar94;
  long lVar95;
  undefined4 uVar96;
  Ray *pRVar97;
  uint uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  uint uVar102;
  ulong uVar103;
  uint uVar104;
  long lVar105;
  ulong uVar106;
  ulong uVar107;
  float fVar108;
  float fVar112;
  float fVar113;
  undefined1 auVar109 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar126 [32];
  undefined1 auVar125 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar139 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  float fVar175;
  uint uVar180;
  uint uVar182;
  float fVar183;
  uint uVar184;
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar179;
  float fVar181;
  float fVar185;
  uint uVar186;
  float fVar187;
  uint uVar188;
  float fVar189;
  uint uVar190;
  uint uVar191;
  undefined1 auVar178 [64];
  float fVar192;
  undefined1 auVar193 [32];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar194 [64];
  float fVar201;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar202 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1670;
  int local_164c;
  ulong local_1648;
  ulong local_1640;
  ulong local_1638;
  ulong local_1630;
  ulong local_1628;
  ulong local_1620;
  long local_1618;
  long local_1610;
  ulong local_1608;
  ulong local_1600;
  ulong local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  long local_15c8;
  float local_15c0;
  float local_15bc;
  float local_15b8;
  float local_15b4;
  float local_15b0;
  uint local_15ac;
  uint local_15a8;
  uint local_15a4;
  uint local_15a0;
  RTCFilterFunctionNArguments local_1590;
  Geometry *local_1560;
  undefined1 auStack_1558 [24];
  undefined1 local_1540 [8];
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  uint uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  uint uStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar108 = ray->tfar;
    if (0.0 <= fVar108) {
      local_1670 = local_1200 + 1;
      aVar2 = (ray->dir).field_0;
      auVar109 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar141._8_4_ = 0x7fffffff;
      auVar141._0_8_ = 0x7fffffff7fffffff;
      auVar141._12_4_ = 0x7fffffff;
      auVar141 = vandps_avx((undefined1  [16])aVar2,auVar141);
      auVar147._8_4_ = 0x219392ef;
      auVar147._0_8_ = 0x219392ef219392ef;
      auVar147._12_4_ = 0x219392ef;
      auVar141 = vcmpps_avx(auVar141,auVar147,1);
      auVar141 = vblendvps_avx((undefined1  [16])aVar2,auVar147,auVar141);
      auVar147 = vrcpps_avx(auVar141);
      fVar113 = auVar147._0_4_;
      auVar131._0_4_ = fVar113 * auVar141._0_4_;
      fVar114 = auVar147._4_4_;
      auVar131._4_4_ = fVar114 * auVar141._4_4_;
      fVar115 = auVar147._8_4_;
      auVar131._8_4_ = fVar115 * auVar141._8_4_;
      fVar117 = auVar147._12_4_;
      auVar131._12_4_ = fVar117 * auVar141._12_4_;
      auVar148._8_4_ = 0x3f800000;
      auVar148._0_8_ = 0x3f8000003f800000;
      auVar148._12_4_ = 0x3f800000;
      auVar141 = vsubps_avx(auVar148,auVar131);
      auVar132._0_4_ = fVar113 + fVar113 * auVar141._0_4_;
      auVar132._4_4_ = fVar114 + fVar114 * auVar141._4_4_;
      auVar132._8_4_ = fVar115 + fVar115 * auVar141._8_4_;
      auVar132._12_4_ = fVar117 + fVar117 * auVar141._12_4_;
      uVar96 = *(undefined4 *)&(ray->org).field_0;
      local_13c0._4_4_ = uVar96;
      local_13c0._0_4_ = uVar96;
      local_13c0._8_4_ = uVar96;
      local_13c0._12_4_ = uVar96;
      local_13c0._16_4_ = uVar96;
      local_13c0._20_4_ = uVar96;
      local_13c0._24_4_ = uVar96;
      local_13c0._28_4_ = uVar96;
      auVar161 = ZEXT3264(local_13c0);
      uVar96 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_13e0._4_4_ = uVar96;
      local_13e0._0_4_ = uVar96;
      local_13e0._8_4_ = uVar96;
      local_13e0._12_4_ = uVar96;
      local_13e0._16_4_ = uVar96;
      local_13e0._20_4_ = uVar96;
      local_13e0._24_4_ = uVar96;
      local_13e0._28_4_ = uVar96;
      auVar170 = ZEXT3264(local_13e0);
      uVar96 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1400._4_4_ = uVar96;
      local_1400._0_4_ = uVar96;
      local_1400._8_4_ = uVar96;
      local_1400._12_4_ = uVar96;
      local_1400._16_4_ = uVar96;
      local_1400._20_4_ = uVar96;
      local_1400._24_4_ = uVar96;
      local_1400._28_4_ = uVar96;
      auVar141 = vshufps_avx(auVar132,auVar132,0);
      local_1420._16_16_ = auVar141;
      local_1420._0_16_ = auVar141;
      auVar194 = ZEXT3264(local_1420);
      auVar141 = vmovshdup_avx(auVar132);
      auVar147 = vshufps_avx(auVar132,auVar132,0x55);
      local_1440._16_16_ = auVar147;
      local_1440._0_16_ = auVar147;
      auVar178 = ZEXT3264(local_1440);
      auVar147 = vshufpd_avx(auVar132,auVar132,1);
      auVar131 = vshufps_avx(auVar132,auVar132,0xaa);
      local_13a0._16_16_ = auVar131;
      local_13a0._0_16_ = auVar131;
      auVar212 = ZEXT3264(local_13a0);
      uVar93 = (ulong)(auVar132._0_4_ < 0.0) << 5;
      auVar146 = ZEXT3264(local_1400);
      uVar99 = (ulong)(auVar141._0_4_ < 0.0) << 5 | 0x40;
      uVar100 = (ulong)(auVar147._0_4_ < 0.0) << 5 | 0x80;
      uVar101 = uVar93 ^ 0x20;
      uVar103 = uVar99 ^ 0x20;
      uVar107 = uVar100 ^ 0x20;
      auVar141 = vshufps_avx(auVar109,auVar109,0);
      local_1460._16_16_ = auVar141;
      local_1460._0_16_ = auVar141;
      auVar154 = ZEXT3264(local_1460);
      auVar141 = vshufps_avx(ZEXT416((uint)fVar108),ZEXT416((uint)fVar108),0);
      local_14c0._16_16_ = auVar141;
      local_14c0._0_16_ = auVar141;
      auVar174 = ZEXT3264(local_14c0);
      local_1620 = (ulong)(((uint)(auVar132._0_4_ < 0.0) << 5) >> 2);
      local_1628 = uVar101 >> 2;
      local_1630 = uVar99 >> 2;
      local_1638 = uVar103 >> 2;
      local_1640 = uVar100 >> 2;
      local_14e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_14e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_1480 = vperm2f128_avx(local_14e0,mm_lookupmask_ps._0_32_,2);
      local_1648 = uVar107 >> 2;
      auVar121._8_4_ = 0xbf800000;
      auVar121._0_8_ = 0xbf800000bf800000;
      auVar121._12_4_ = 0xbf800000;
      auVar121._16_4_ = 0xbf800000;
      auVar121._20_4_ = 0xbf800000;
      auVar121._24_4_ = 0xbf800000;
      auVar121._28_4_ = 0xbf800000;
      auVar126._8_4_ = 0x3f800000;
      auVar126._0_8_ = 0x3f8000003f800000;
      auVar126._12_4_ = 0x3f800000;
      auVar126._16_4_ = 0x3f800000;
      auVar126._20_4_ = 0x3f800000;
      auVar126._24_4_ = 0x3f800000;
      auVar126._28_4_ = 0x3f800000;
      _local_14a0 = vblendvps_avx(auVar126,auVar121,local_1480);
      local_15d0 = uVar93;
      local_15d8 = uVar99;
      local_15e0 = uVar100;
      local_15e8 = uVar101;
      local_15f0 = uVar103;
      local_15f8 = uVar107;
      pRVar97 = ray;
LAB_00e805e1:
      if (local_1670 != local_1200) {
        uVar106 = local_1670[-1];
        local_1670 = local_1670 + -1;
        while ((uVar106 & 8) == 0) {
          auVar121 = vsubps_avx(*(undefined1 (*) [32])(uVar106 + 0x40 + uVar93),auVar161._0_32_);
          auVar10._4_4_ = auVar194._4_4_ * auVar121._4_4_;
          auVar10._0_4_ = auVar194._0_4_ * auVar121._0_4_;
          auVar10._8_4_ = auVar194._8_4_ * auVar121._8_4_;
          auVar10._12_4_ = auVar194._12_4_ * auVar121._12_4_;
          auVar10._16_4_ = auVar194._16_4_ * auVar121._16_4_;
          auVar10._20_4_ = auVar194._20_4_ * auVar121._20_4_;
          auVar10._24_4_ = auVar194._24_4_ * auVar121._24_4_;
          auVar10._28_4_ = auVar121._28_4_;
          auVar121 = vsubps_avx(*(undefined1 (*) [32])(uVar106 + 0x40 + uVar99),auVar170._0_32_);
          auVar61._4_4_ = auVar178._4_4_ * auVar121._4_4_;
          auVar61._0_4_ = auVar178._0_4_ * auVar121._0_4_;
          auVar61._8_4_ = auVar178._8_4_ * auVar121._8_4_;
          auVar61._12_4_ = auVar178._12_4_ * auVar121._12_4_;
          auVar61._16_4_ = auVar178._16_4_ * auVar121._16_4_;
          auVar61._20_4_ = auVar178._20_4_ * auVar121._20_4_;
          auVar61._24_4_ = auVar178._24_4_ * auVar121._24_4_;
          auVar61._28_4_ = auVar121._28_4_;
          auVar121 = vmaxps_avx(auVar10,auVar61);
          auVar126 = vsubps_avx(*(undefined1 (*) [32])(uVar106 + 0x40 + uVar100),auVar146._0_32_);
          auVar62._4_4_ = auVar212._4_4_ * auVar126._4_4_;
          auVar62._0_4_ = auVar212._0_4_ * auVar126._0_4_;
          auVar62._8_4_ = auVar212._8_4_ * auVar126._8_4_;
          auVar62._12_4_ = auVar212._12_4_ * auVar126._12_4_;
          auVar62._16_4_ = auVar212._16_4_ * auVar126._16_4_;
          auVar62._20_4_ = auVar212._20_4_ * auVar126._20_4_;
          auVar62._24_4_ = auVar212._24_4_ * auVar126._24_4_;
          auVar62._28_4_ = auVar126._28_4_;
          auVar126 = vsubps_avx(*(undefined1 (*) [32])(uVar106 + 0x40 + uVar101),auVar161._0_32_);
          auVar63._4_4_ = auVar194._4_4_ * auVar126._4_4_;
          auVar63._0_4_ = auVar194._0_4_ * auVar126._0_4_;
          auVar63._8_4_ = auVar194._8_4_ * auVar126._8_4_;
          auVar63._12_4_ = auVar194._12_4_ * auVar126._12_4_;
          auVar63._16_4_ = auVar194._16_4_ * auVar126._16_4_;
          auVar63._20_4_ = auVar194._20_4_ * auVar126._20_4_;
          auVar63._24_4_ = auVar194._24_4_ * auVar126._24_4_;
          auVar63._28_4_ = auVar126._28_4_;
          auVar126 = vsubps_avx(*(undefined1 (*) [32])(uVar106 + 0x40 + uVar103),auVar170._0_32_);
          auVar64._4_4_ = auVar178._4_4_ * auVar126._4_4_;
          auVar64._0_4_ = auVar178._0_4_ * auVar126._0_4_;
          auVar64._8_4_ = auVar178._8_4_ * auVar126._8_4_;
          auVar64._12_4_ = auVar178._12_4_ * auVar126._12_4_;
          auVar64._16_4_ = auVar178._16_4_ * auVar126._16_4_;
          auVar64._20_4_ = auVar178._20_4_ * auVar126._20_4_;
          auVar64._24_4_ = auVar178._24_4_ * auVar126._24_4_;
          auVar64._28_4_ = auVar126._28_4_;
          auVar10 = vminps_avx(auVar63,auVar64);
          auVar126 = vsubps_avx(*(undefined1 (*) [32])(uVar106 + 0x40 + uVar107),auVar146._0_32_);
          auVar65._4_4_ = auVar212._4_4_ * auVar126._4_4_;
          auVar65._0_4_ = auVar212._0_4_ * auVar126._0_4_;
          auVar65._8_4_ = auVar212._8_4_ * auVar126._8_4_;
          auVar65._12_4_ = auVar212._12_4_ * auVar126._12_4_;
          auVar65._16_4_ = auVar212._16_4_ * auVar126._16_4_;
          auVar65._20_4_ = auVar212._20_4_ * auVar126._20_4_;
          auVar65._24_4_ = auVar212._24_4_ * auVar126._24_4_;
          auVar65._28_4_ = auVar126._28_4_;
          auVar126 = vmaxps_avx(auVar62,auVar154._0_32_);
          auVar121 = vmaxps_avx(auVar121,auVar126);
          auVar126 = vminps_avx(auVar65,auVar174._0_32_);
          auVar126 = vminps_avx(auVar10,auVar126);
          auVar121 = vcmpps_avx(auVar121,auVar126,2);
          uVar89 = vmovmskps_avx(auVar121);
          if (uVar89 == 0) goto LAB_00e805e1;
          uVar89 = uVar89 & 0xff;
          uVar90 = uVar106 & 0xfffffffffffffff0;
          pRVar97 = (Ray *)0x0;
          if (uVar89 != 0) {
            for (; (uVar89 >> (long)pRVar97 & 1) == 0;
                pRVar97 = (Ray *)((long)(pRVar97->org).field_0.m128 + 1)) {
            }
          }
          uVar106 = *(ulong *)(uVar90 + (long)pRVar97 * 8);
          uVar89 = uVar89 - 1 & uVar89;
          uVar94 = (ulong)uVar89;
          if (uVar89 != 0) {
            do {
              *local_1670 = uVar106;
              local_1670 = local_1670 + 1;
              pRVar97 = (Ray *)0x0;
              if (uVar94 != 0) {
                for (; (uVar94 >> (long)pRVar97 & 1) == 0;
                    pRVar97 = (Ray *)((long)(pRVar97->org).field_0.m128 + 1)) {
                }
              }
              uVar106 = *(ulong *)(uVar90 + (long)pRVar97 * 8);
              uVar94 = uVar94 - 1 & uVar94;
            } while (uVar94 != 0);
          }
        }
        local_1618 = (ulong)((uint)uVar106 & 0xf) - 8;
        uVar106 = uVar106 & 0xfffffffffffffff0;
        for (local_1610 = 0; local_1610 != local_1618; local_1610 = local_1610 + 1) {
          lVar91 = local_1610 * 0x90;
          local_15c8 = uVar106 + lVar91;
          auVar109._8_8_ = 0;
          auVar109._0_8_ = *(ulong *)(uVar106 + 0x40 + lVar91);
          auVar124._8_8_ = 0;
          auVar124._0_8_ = *(ulong *)(uVar106 + 0x48 + lVar91);
          auVar141 = vpminub_avx(auVar109,auVar124);
          auVar141 = vpcmpeqb_avx(auVar109,auVar141);
          auVar120._8_8_ = 0;
          auVar120._0_8_ = *(ulong *)(uVar106 + 0x44 + lVar91);
          auVar133._8_8_ = 0;
          auVar133._0_8_ = *(ulong *)(uVar106 + 0x4c + lVar91);
          auVar109 = vpminub_avx(auVar120,auVar133);
          auVar109 = vpcmpeqb_avx(auVar120,auVar109);
          fVar108 = *(float *)(uVar106 + 0x70 + lVar91);
          fVar113 = *(float *)(uVar106 + 0x7c + lVar91);
          auVar125._8_8_ = 0;
          auVar125._0_8_ = *(ulong *)(local_1620 + 0x40 + local_15c8);
          auVar147 = vpmovzxbd_avx(auVar125);
          auVar149._8_8_ = 0;
          auVar149._0_8_ = *(ulong *)(local_1620 + 0x44 + local_15c8);
          auVar131 = vpmovzxbd_avx(auVar149);
          auVar127._16_16_ = auVar131;
          auVar127._0_16_ = auVar147;
          auVar121 = vcvtdq2ps_avx(auVar127);
          auVar128._0_4_ = fVar108 + fVar113 * auVar121._0_4_;
          auVar128._4_4_ = fVar108 + fVar113 * auVar121._4_4_;
          auVar128._8_4_ = fVar108 + fVar113 * auVar121._8_4_;
          auVar128._12_4_ = fVar108 + fVar113 * auVar121._12_4_;
          auVar128._16_4_ = fVar108 + fVar113 * auVar121._16_4_;
          auVar128._20_4_ = fVar108 + fVar113 * auVar121._20_4_;
          auVar128._24_4_ = fVar108 + fVar113 * auVar121._24_4_;
          auVar128._28_4_ = fVar108 + auVar121._28_4_;
          auVar150._8_8_ = 0;
          auVar150._0_8_ = *(ulong *)(local_1628 + 0x40 + local_15c8);
          auVar147 = vpmovzxbd_avx(auVar150);
          auVar155._8_8_ = 0;
          auVar155._0_8_ = *(ulong *)(local_1628 + 0x44 + local_15c8);
          auVar131 = vpmovzxbd_avx(auVar155);
          auVar151._16_16_ = auVar131;
          auVar151._0_16_ = auVar147;
          auVar121 = vcvtdq2ps_avx(auVar151);
          auVar134._0_4_ = fVar108 + fVar113 * auVar121._0_4_;
          auVar134._4_4_ = fVar108 + fVar113 * auVar121._4_4_;
          auVar134._8_4_ = fVar108 + fVar113 * auVar121._8_4_;
          auVar134._12_4_ = fVar108 + fVar113 * auVar121._12_4_;
          auVar134._16_4_ = fVar108 + fVar113 * auVar121._16_4_;
          auVar134._20_4_ = fVar108 + fVar113 * auVar121._20_4_;
          auVar134._24_4_ = fVar108 + fVar113 * auVar121._24_4_;
          auVar134._28_4_ = fVar108 + fVar113;
          fVar108 = *(float *)(uVar106 + 0x74 + lVar91);
          fVar113 = *(float *)(uVar106 + 0x80 + lVar91);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = *(ulong *)(local_1630 + 0x40 + local_15c8);
          auVar147 = vpmovzxbd_avx(auVar139);
          auVar162._8_8_ = 0;
          auVar162._0_8_ = *(ulong *)(local_1630 + 0x44 + local_15c8);
          auVar131 = vpmovzxbd_avx(auVar162);
          auVar142._16_16_ = auVar131;
          auVar142._0_16_ = auVar147;
          auVar121 = vcvtdq2ps_avx(auVar142);
          auVar143._0_4_ = fVar108 + fVar113 * auVar121._0_4_;
          auVar143._4_4_ = fVar108 + fVar113 * auVar121._4_4_;
          auVar143._8_4_ = fVar108 + fVar113 * auVar121._8_4_;
          auVar143._12_4_ = fVar108 + fVar113 * auVar121._12_4_;
          auVar143._16_4_ = fVar108 + fVar113 * auVar121._16_4_;
          auVar143._20_4_ = fVar108 + fVar113 * auVar121._20_4_;
          auVar143._24_4_ = fVar108 + fVar113 * auVar121._24_4_;
          auVar143._28_4_ = fVar108 + auVar121._28_4_;
          auVar163._8_8_ = 0;
          auVar163._0_8_ = *(ulong *)(local_1638 + 0x40 + local_15c8);
          auVar147 = vpmovzxbd_avx(auVar163);
          auVar171._8_8_ = 0;
          auVar171._0_8_ = *(ulong *)(local_1638 + 0x44 + local_15c8);
          auVar131 = vpmovzxbd_avx(auVar171);
          auVar166._16_16_ = auVar131;
          auVar166._0_16_ = auVar147;
          auVar121 = vcvtdq2ps_avx(auVar166);
          auVar152._0_4_ = fVar108 + fVar113 * auVar121._0_4_;
          auVar152._4_4_ = fVar108 + fVar113 * auVar121._4_4_;
          auVar152._8_4_ = fVar108 + fVar113 * auVar121._8_4_;
          auVar152._12_4_ = fVar108 + fVar113 * auVar121._12_4_;
          auVar152._16_4_ = fVar108 + fVar113 * auVar121._16_4_;
          auVar152._20_4_ = fVar108 + fVar113 * auVar121._20_4_;
          auVar152._24_4_ = fVar108 + fVar113 * auVar121._24_4_;
          auVar152._28_4_ = fVar108 + fVar113;
          auVar156._8_8_ = 0;
          auVar156._0_8_ = *(ulong *)(local_1640 + 0x40 + local_15c8);
          auVar147 = vpmovzxbd_avx(auVar156);
          auVar164._8_8_ = 0;
          auVar164._0_8_ = *(ulong *)(local_1640 + 0x44 + local_15c8);
          auVar131 = vpmovzxbd_avx(auVar164);
          auVar157._16_16_ = auVar131;
          auVar157._0_16_ = auVar147;
          auVar165._8_8_ = 0;
          auVar165._0_8_ = *(ulong *)(local_1648 + 0x40 + local_15c8);
          auVar147 = vpmovzxbd_avx(auVar165);
          auVar172._8_8_ = 0;
          auVar172._0_8_ = *(ulong *)(local_1648 + 0x44 + local_15c8);
          auVar131 = vpmovzxbd_avx(auVar172);
          auVar167._16_16_ = auVar131;
          auVar167._0_16_ = auVar147;
          fVar108 = *(float *)(uVar106 + 0x84 + lVar91);
          auVar121 = vcvtdq2ps_avx(auVar157);
          auVar126 = vcvtdq2ps_avx(auVar167);
          fVar113 = *(float *)(uVar106 + 0x78 + lVar91);
          auVar158._0_4_ = fVar113 + fVar108 * auVar121._0_4_;
          auVar158._4_4_ = fVar113 + fVar108 * auVar121._4_4_;
          auVar158._8_4_ = fVar113 + fVar108 * auVar121._8_4_;
          auVar158._12_4_ = fVar113 + fVar108 * auVar121._12_4_;
          auVar158._16_4_ = fVar113 + fVar108 * auVar121._16_4_;
          auVar158._20_4_ = fVar113 + fVar108 * auVar121._20_4_;
          auVar158._24_4_ = fVar113 + fVar108 * auVar121._24_4_;
          auVar158._28_4_ = fVar113 + auVar121._28_4_;
          auVar168._0_4_ = fVar113 + fVar108 * auVar126._0_4_;
          auVar168._4_4_ = fVar113 + fVar108 * auVar126._4_4_;
          auVar168._8_4_ = fVar113 + fVar108 * auVar126._8_4_;
          auVar168._12_4_ = fVar113 + fVar108 * auVar126._12_4_;
          auVar168._16_4_ = fVar113 + fVar108 * auVar126._16_4_;
          auVar168._20_4_ = fVar113 + fVar108 * auVar126._20_4_;
          auVar168._24_4_ = fVar113 + fVar108 * auVar126._24_4_;
          auVar168._28_4_ = fVar113 + auVar126._28_4_;
          auVar121 = vsubps_avx(auVar128,auVar161._0_32_);
          auVar66._4_4_ = auVar194._4_4_ * auVar121._4_4_;
          auVar66._0_4_ = auVar194._0_4_ * auVar121._0_4_;
          auVar66._8_4_ = auVar194._8_4_ * auVar121._8_4_;
          auVar66._12_4_ = auVar194._12_4_ * auVar121._12_4_;
          auVar66._16_4_ = auVar194._16_4_ * auVar121._16_4_;
          auVar66._20_4_ = auVar194._20_4_ * auVar121._20_4_;
          auVar66._24_4_ = auVar194._24_4_ * auVar121._24_4_;
          auVar66._28_4_ = auVar121._28_4_;
          auVar121 = vsubps_avx(auVar143,auVar170._0_32_);
          auVar67._4_4_ = auVar178._4_4_ * auVar121._4_4_;
          auVar67._0_4_ = auVar178._0_4_ * auVar121._0_4_;
          auVar67._8_4_ = auVar178._8_4_ * auVar121._8_4_;
          auVar67._12_4_ = auVar178._12_4_ * auVar121._12_4_;
          auVar67._16_4_ = auVar178._16_4_ * auVar121._16_4_;
          auVar67._20_4_ = auVar178._20_4_ * auVar121._20_4_;
          auVar67._24_4_ = auVar178._24_4_ * auVar121._24_4_;
          auVar67._28_4_ = auVar121._28_4_;
          auVar121 = vmaxps_avx(auVar66,auVar67);
          auVar126 = vsubps_avx(auVar134,auVar161._0_32_);
          auVar68._4_4_ = auVar194._4_4_ * auVar126._4_4_;
          auVar68._0_4_ = auVar194._0_4_ * auVar126._0_4_;
          auVar68._8_4_ = auVar194._8_4_ * auVar126._8_4_;
          auVar68._12_4_ = auVar194._12_4_ * auVar126._12_4_;
          auVar68._16_4_ = auVar194._16_4_ * auVar126._16_4_;
          auVar68._20_4_ = auVar194._20_4_ * auVar126._20_4_;
          auVar68._24_4_ = auVar194._24_4_ * auVar126._24_4_;
          auVar68._28_4_ = auVar126._28_4_;
          auVar126 = vsubps_avx(auVar152,auVar170._0_32_);
          auVar69._4_4_ = auVar178._4_4_ * auVar126._4_4_;
          auVar69._0_4_ = auVar178._0_4_ * auVar126._0_4_;
          auVar69._8_4_ = auVar178._8_4_ * auVar126._8_4_;
          auVar69._12_4_ = auVar178._12_4_ * auVar126._12_4_;
          auVar69._16_4_ = auVar178._16_4_ * auVar126._16_4_;
          auVar69._20_4_ = auVar178._20_4_ * auVar126._20_4_;
          auVar69._24_4_ = auVar178._24_4_ * auVar126._24_4_;
          auVar69._28_4_ = auVar126._28_4_;
          auVar10 = vminps_avx(auVar68,auVar69);
          auVar126 = vsubps_avx(auVar158,auVar146._0_32_);
          auVar70._4_4_ = auVar212._4_4_ * auVar126._4_4_;
          auVar70._0_4_ = auVar212._0_4_ * auVar126._0_4_;
          auVar70._8_4_ = auVar212._8_4_ * auVar126._8_4_;
          auVar70._12_4_ = auVar212._12_4_ * auVar126._12_4_;
          auVar70._16_4_ = auVar212._16_4_ * auVar126._16_4_;
          auVar70._20_4_ = auVar212._20_4_ * auVar126._20_4_;
          auVar70._24_4_ = auVar212._24_4_ * auVar126._24_4_;
          auVar70._28_4_ = auVar126._28_4_;
          auVar126 = vmaxps_avx(auVar70,auVar154._0_32_);
          auVar121 = vmaxps_avx(auVar121,auVar126);
          auVar126 = vsubps_avx(auVar168,auVar146._0_32_);
          auVar71._4_4_ = auVar212._4_4_ * auVar126._4_4_;
          auVar71._0_4_ = auVar212._0_4_ * auVar126._0_4_;
          auVar71._8_4_ = auVar212._8_4_ * auVar126._8_4_;
          auVar71._12_4_ = auVar212._12_4_ * auVar126._12_4_;
          auVar71._16_4_ = auVar212._16_4_ * auVar126._16_4_;
          auVar71._20_4_ = auVar212._20_4_ * auVar126._20_4_;
          auVar71._24_4_ = auVar212._24_4_ * auVar126._24_4_;
          auVar71._28_4_ = auVar126._28_4_;
          auVar126 = vminps_avx(auVar71,local_14c0);
          auVar126 = vminps_avx(auVar10,auVar126);
          auVar121 = vcmpps_avx(auVar121,auVar126,2);
          auVar147 = vpcmpeqd_avx(auVar126._0_16_,auVar126._0_16_);
          auVar141 = vpmovsxbd_avx(auVar141 ^ auVar147);
          auVar109 = vpmovsxbd_avx(auVar109 ^ auVar147);
          auVar110._16_16_ = auVar109;
          auVar110._0_16_ = auVar141;
          auVar126 = vcvtdq2ps_avx(auVar110);
          auVar122._8_4_ = 0xbf800000;
          auVar122._0_8_ = 0xbf800000bf800000;
          auVar122._12_4_ = 0xbf800000;
          auVar122._16_4_ = 0xbf800000;
          auVar122._20_4_ = 0xbf800000;
          auVar122._24_4_ = 0xbf800000;
          auVar122._28_4_ = 0xbf800000;
          auVar126 = vcmpps_avx(auVar122,auVar126,1);
          auVar121 = vandps_avx(auVar121,auVar126);
          uVar96 = vmovmskps_avx(auVar121);
          for (uVar90 = CONCAT44((int)((ulong)pRVar97 >> 0x20),uVar96);
              auVar174 = ZEXT3264(local_14c0), uVar90 != 0; uVar90 = uVar90 & uVar90 - 1) {
            lVar91 = 0;
            if (uVar90 != 0) {
              for (; (uVar90 >> lVar91 & 1) == 0; lVar91 = lVar91 + 1) {
              }
            }
            uVar4 = *(ushort *)(local_15c8 + lVar91 * 8);
            uVar5 = *(ushort *)(local_15c8 + 2 + lVar91 * 8);
            uVar89 = *(uint *)(local_15c8 + 0x88);
            uVar6 = *(uint *)(local_15c8 + 4 + lVar91 * 8);
            local_1600 = (ulong)uVar89;
            local_1560 = (context->scene->geometries).items[uVar89].ptr;
            lVar91 = *(long *)&local_1560->field_0x58;
            local_1608 = (ulong)uVar6;
            lVar95 = local_1560[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                     * (ulong)uVar6;
            uVar102 = uVar4 & 0x7fff;
            uVar104 = uVar5 & 0x7fff;
            uVar98 = *(uint *)(lVar91 + 4 + lVar95);
            uVar100 = (ulong)uVar98;
            uVar99 = (ulong)(uVar98 * uVar104 + *(int *)(lVar91 + lVar95) + uVar102);
            p_Var7 = local_1560[1].intersectionFilterN;
            lVar8 = *(long *)&local_1560[1].time_range.upper;
            auVar141 = *(undefined1 (*) [16])(lVar8 + (long)p_Var7 * uVar99);
            auVar109 = *(undefined1 (*) [16])(lVar8 + (uVar99 + 1) * (long)p_Var7);
            auVar147 = *(undefined1 (*) [16])(lVar8 + (uVar99 + uVar100) * (long)p_Var7);
            lVar105 = uVar99 + uVar100 + 1;
            auVar131 = *(undefined1 (*) [16])(lVar8 + lVar105 * (long)p_Var7);
            uVar93 = (ulong)(-1 < (short)uVar4);
            auVar132 = *(undefined1 (*) [16])(lVar8 + (uVar99 + uVar93 + 1) * (long)p_Var7);
            lVar92 = uVar93 + lVar105;
            auVar148 = *(undefined1 (*) [16])(lVar8 + lVar92 * (long)p_Var7);
            uVar93 = 0;
            if (-1 < (short)uVar5) {
              uVar93 = uVar100;
            }
            auVar120 = *(undefined1 (*) [16])(lVar8 + (uVar99 + uVar100 + uVar93) * (long)p_Var7);
            auVar124 = *(undefined1 (*) [16])(lVar8 + (lVar105 + uVar93) * (long)p_Var7);
            auVar125 = *(undefined1 (*) [16])(lVar8 + (uVar93 + lVar92) * (long)p_Var7);
            auVar139 = vunpcklps_avx(auVar141,auVar131);
            auVar141 = vunpckhps_avx(auVar141,auVar131);
            auVar149 = vunpcklps_avx(auVar109,auVar147);
            auVar133 = vunpckhps_avx(auVar109,auVar147);
            auVar133 = vunpcklps_avx(auVar141,auVar133);
            auVar150 = vunpcklps_avx(auVar139,auVar149);
            auVar141 = vunpckhps_avx(auVar139,auVar149);
            auVar139 = vunpcklps_avx(auVar109,auVar148);
            auVar109 = vunpckhps_avx(auVar109,auVar148);
            auVar149 = vunpcklps_avx(auVar132,auVar131);
            auVar132 = vunpckhps_avx(auVar132,auVar131);
            auVar155 = vunpcklps_avx(auVar109,auVar132);
            auVar156 = vunpcklps_avx(auVar139,auVar149);
            auVar109 = vunpckhps_avx(auVar139,auVar149);
            auVar139 = vunpcklps_avx(auVar131,auVar125);
            auVar132 = vunpckhps_avx(auVar131,auVar125);
            auVar125 = vunpcklps_avx(auVar148,auVar124);
            auVar148 = vunpckhps_avx(auVar148,auVar124);
            auVar148 = vunpcklps_avx(auVar132,auVar148);
            auVar149 = vunpcklps_avx(auVar139,auVar125);
            auVar132 = vunpckhps_avx(auVar139,auVar125);
            auVar125 = vunpcklps_avx(auVar147,auVar124);
            auVar147 = vunpckhps_avx(auVar147,auVar124);
            auVar124 = vunpcklps_avx(auVar131,auVar120);
            auVar131 = vunpckhps_avx(auVar131,auVar120);
            auVar131 = vunpcklps_avx(auVar147,auVar131);
            auVar120 = vunpcklps_avx(auVar125,auVar124);
            auVar147 = vunpckhps_avx(auVar125,auVar124);
            auVar123._16_16_ = auVar149;
            auVar123._0_16_ = auVar150;
            auVar153._16_16_ = auVar132;
            auVar153._0_16_ = auVar141;
            auVar169._16_16_ = auVar148;
            auVar169._0_16_ = auVar133;
            auVar135._16_16_ = auVar156;
            auVar135._0_16_ = auVar156;
            auVar144._16_16_ = auVar109;
            auVar144._0_16_ = auVar109;
            auVar129._16_16_ = auVar155;
            auVar129._0_16_ = auVar155;
            auVar177._16_16_ = auVar120;
            auVar177._0_16_ = auVar120;
            auVar193._16_16_ = auVar147;
            auVar193._0_16_ = auVar147;
            auVar202._16_16_ = auVar131;
            auVar202._0_16_ = auVar131;
            local_1500 = vsubps_avx(auVar123,auVar135);
            local_1520 = vsubps_avx(auVar153,auVar144);
            auVar121 = vsubps_avx(auVar169,auVar129);
            auVar126 = vsubps_avx(auVar177,auVar123);
            auVar10 = vsubps_avx(auVar193,auVar153);
            auVar61 = vsubps_avx(auVar202,auVar169);
            fVar115 = local_1520._0_4_;
            fVar201 = auVar61._0_4_;
            fVar13 = local_1520._4_4_;
            fVar203 = auVar61._4_4_;
            auVar72._4_4_ = fVar203 * fVar13;
            auVar72._0_4_ = fVar201 * fVar115;
            fVar21 = local_1520._8_4_;
            fVar204 = auVar61._8_4_;
            auVar72._8_4_ = fVar204 * fVar21;
            fVar29 = local_1520._12_4_;
            fVar205 = auVar61._12_4_;
            auVar72._12_4_ = fVar205 * fVar29;
            fVar37 = local_1520._16_4_;
            fVar206 = auVar61._16_4_;
            auVar72._16_4_ = fVar206 * fVar37;
            fVar45 = local_1520._20_4_;
            fVar207 = auVar61._20_4_;
            auVar72._20_4_ = fVar207 * fVar45;
            fVar53 = local_1520._24_4_;
            fVar208 = auVar61._24_4_;
            auVar72._24_4_ = fVar208 * fVar53;
            auVar72._28_4_ = auVar155._12_4_;
            fVar117 = auVar121._0_4_;
            fVar192 = auVar10._0_4_;
            fVar14 = auVar121._4_4_;
            fVar195 = auVar10._4_4_;
            auVar74._4_4_ = fVar195 * fVar14;
            auVar74._0_4_ = fVar192 * fVar117;
            fVar22 = auVar121._8_4_;
            fVar196 = auVar10._8_4_;
            auVar74._8_4_ = fVar196 * fVar22;
            fVar30 = auVar121._12_4_;
            fVar197 = auVar10._12_4_;
            auVar74._12_4_ = fVar197 * fVar30;
            fVar38 = auVar121._16_4_;
            fVar198 = auVar10._16_4_;
            auVar74._16_4_ = fVar198 * fVar38;
            fVar46 = auVar121._20_4_;
            fVar199 = auVar10._20_4_;
            auVar74._20_4_ = fVar199 * fVar46;
            fVar54 = auVar121._24_4_;
            uVar73 = auVar156._12_4_;
            fVar200 = auVar10._24_4_;
            auVar74._24_4_ = fVar200 * fVar54;
            auVar74._28_4_ = uVar73;
            _local_1540 = vsubps_avx(auVar74,auVar72);
            auVar67 = _local_1540;
            fVar175 = auVar126._0_4_;
            fVar179 = auVar126._4_4_;
            auVar75._4_4_ = fVar179 * fVar14;
            auVar75._0_4_ = fVar175 * fVar117;
            fVar181 = auVar126._8_4_;
            auVar75._8_4_ = fVar181 * fVar22;
            fVar183 = auVar126._12_4_;
            auVar75._12_4_ = fVar183 * fVar30;
            fVar185 = auVar126._16_4_;
            auVar75._16_4_ = fVar185 * fVar38;
            fVar187 = auVar126._20_4_;
            auVar75._20_4_ = fVar187 * fVar46;
            fVar189 = auVar126._24_4_;
            auVar75._24_4_ = fVar189 * fVar54;
            auVar75._28_4_ = uVar73;
            fVar119 = local_1500._0_4_;
            fVar15 = local_1500._4_4_;
            auVar77._4_4_ = fVar203 * fVar15;
            auVar77._0_4_ = fVar201 * fVar119;
            fVar23 = local_1500._8_4_;
            auVar77._8_4_ = fVar204 * fVar23;
            fVar31 = local_1500._12_4_;
            auVar77._12_4_ = fVar205 * fVar31;
            fVar39 = local_1500._16_4_;
            auVar77._16_4_ = fVar206 * fVar39;
            fVar47 = local_1500._20_4_;
            auVar77._20_4_ = fVar207 * fVar47;
            fVar55 = local_1500._24_4_;
            fVar76 = auVar109._12_4_;
            auVar77._24_4_ = fVar208 * fVar55;
            auVar77._28_4_ = fVar76;
            auVar121 = vsubps_avx(auVar77,auVar75);
            auVar78._4_4_ = fVar195 * fVar15;
            auVar78._0_4_ = fVar192 * fVar119;
            auVar78._8_4_ = fVar196 * fVar23;
            auVar78._12_4_ = fVar197 * fVar31;
            auVar78._16_4_ = fVar198 * fVar39;
            auVar78._20_4_ = fVar199 * fVar47;
            auVar78._24_4_ = fVar200 * fVar55;
            auVar78._28_4_ = fVar76;
            auVar79._4_4_ = fVar179 * fVar13;
            auVar79._0_4_ = fVar175 * fVar115;
            auVar79._8_4_ = fVar181 * fVar21;
            auVar79._12_4_ = fVar183 * fVar29;
            auVar79._16_4_ = fVar185 * fVar37;
            auVar79._20_4_ = fVar187 * fVar45;
            auVar79._24_4_ = fVar189 * fVar53;
            auVar79._28_4_ = local_1520._28_4_;
            auVar62 = vsubps_avx(auVar79,auVar78);
            uVar96 = *(undefined4 *)&(ray->org).field_0;
            auVar209._4_4_ = uVar96;
            auVar209._0_4_ = uVar96;
            auVar209._8_4_ = uVar96;
            auVar209._12_4_ = uVar96;
            auVar209._16_4_ = uVar96;
            auVar209._20_4_ = uVar96;
            auVar209._24_4_ = uVar96;
            auVar209._28_4_ = uVar96;
            uVar96 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar210._4_4_ = uVar96;
            auVar210._0_4_ = uVar96;
            auVar210._8_4_ = uVar96;
            auVar210._12_4_ = uVar96;
            auVar210._16_4_ = uVar96;
            auVar210._20_4_ = uVar96;
            auVar210._24_4_ = uVar96;
            auVar210._28_4_ = uVar96;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar211._4_4_ = uVar1;
            auVar211._0_4_ = uVar1;
            auVar211._8_4_ = uVar1;
            auVar211._12_4_ = uVar1;
            auVar211._16_4_ = uVar1;
            auVar211._20_4_ = uVar1;
            auVar211._24_4_ = uVar1;
            auVar211._28_4_ = uVar1;
            fVar108 = (ray->dir).field_0.m128[1];
            auVar63 = vsubps_avx(auVar123,auVar209);
            fVar113 = (ray->dir).field_0.m128[2];
            auVar64 = vsubps_avx(auVar153,auVar210);
            auVar65 = vsubps_avx(auVar169,auVar211);
            fVar116 = auVar65._0_4_;
            fVar16 = auVar65._4_4_;
            auVar80._4_4_ = fVar108 * fVar16;
            auVar80._0_4_ = fVar108 * fVar116;
            fVar24 = auVar65._8_4_;
            auVar80._8_4_ = fVar108 * fVar24;
            fVar32 = auVar65._12_4_;
            auVar80._12_4_ = fVar108 * fVar32;
            fVar40 = auVar65._16_4_;
            auVar80._16_4_ = fVar108 * fVar40;
            fVar48 = auVar65._20_4_;
            auVar80._20_4_ = fVar108 * fVar48;
            fVar56 = auVar65._24_4_;
            auVar80._24_4_ = fVar108 * fVar56;
            auVar80._28_4_ = uVar96;
            fVar118 = auVar64._0_4_;
            fVar17 = auVar64._4_4_;
            auVar81._4_4_ = fVar113 * fVar17;
            auVar81._0_4_ = fVar113 * fVar118;
            fVar25 = auVar64._8_4_;
            auVar81._8_4_ = fVar113 * fVar25;
            fVar33 = auVar64._12_4_;
            auVar81._12_4_ = fVar113 * fVar33;
            fVar41 = auVar64._16_4_;
            auVar81._16_4_ = fVar113 * fVar41;
            fVar49 = auVar64._20_4_;
            auVar81._20_4_ = fVar113 * fVar49;
            fVar57 = auVar64._24_4_;
            auVar81._24_4_ = fVar113 * fVar57;
            auVar81._28_4_ = uVar1;
            auVar64 = vsubps_avx(auVar81,auVar80);
            fVar114 = (ray->dir).field_0.m128[0];
            fVar112 = auVar63._0_4_;
            fVar18 = auVar63._4_4_;
            auVar82._4_4_ = fVar113 * fVar18;
            auVar82._0_4_ = fVar113 * fVar112;
            fVar26 = auVar63._8_4_;
            auVar82._8_4_ = fVar113 * fVar26;
            fVar34 = auVar63._12_4_;
            auVar82._12_4_ = fVar113 * fVar34;
            fVar42 = auVar63._16_4_;
            auVar82._16_4_ = fVar113 * fVar42;
            fVar50 = auVar63._20_4_;
            auVar82._20_4_ = fVar113 * fVar50;
            fVar58 = auVar63._24_4_;
            auVar82._24_4_ = fVar113 * fVar58;
            auVar82._28_4_ = local_1540._28_4_;
            auVar83._4_4_ = fVar114 * fVar16;
            auVar83._0_4_ = fVar114 * fVar116;
            auVar83._8_4_ = fVar114 * fVar24;
            auVar83._12_4_ = fVar114 * fVar32;
            auVar83._16_4_ = fVar114 * fVar40;
            auVar83._20_4_ = fVar114 * fVar48;
            auVar83._24_4_ = fVar114 * fVar56;
            auVar83._28_4_ = uVar73;
            auVar65 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = fVar114 * fVar17;
            auVar84._0_4_ = fVar114 * fVar118;
            auVar84._8_4_ = fVar114 * fVar25;
            auVar84._12_4_ = fVar114 * fVar33;
            auVar84._16_4_ = fVar114 * fVar41;
            auVar84._20_4_ = fVar114 * fVar49;
            auVar84._24_4_ = fVar114 * fVar57;
            auVar84._28_4_ = uVar73;
            auVar85._4_4_ = fVar108 * fVar18;
            auVar85._0_4_ = fVar108 * fVar112;
            auVar85._8_4_ = fVar108 * fVar26;
            auVar85._12_4_ = fVar108 * fVar34;
            auVar85._16_4_ = fVar108 * fVar42;
            auVar85._20_4_ = fVar108 * fVar50;
            auVar85._24_4_ = fVar108 * fVar58;
            auVar85._28_4_ = fVar76;
            auVar66 = vsubps_avx(auVar85,auVar84);
            fVar11 = auVar62._0_4_;
            fVar19 = auVar62._4_4_;
            fVar27 = auVar62._8_4_;
            fVar35 = auVar62._12_4_;
            fVar43 = auVar62._16_4_;
            fVar51 = auVar62._20_4_;
            fVar59 = auVar62._24_4_;
            fVar12 = auVar121._0_4_;
            fVar20 = auVar121._4_4_;
            fVar28 = auVar121._8_4_;
            fVar36 = auVar121._12_4_;
            fVar44 = auVar121._16_4_;
            fVar52 = auVar121._20_4_;
            fVar60 = auVar121._24_4_;
            auVar145._0_4_ = fVar114 * (float)local_1540._0_4_ + fVar108 * fVar12 + fVar113 * fVar11
            ;
            auVar145._4_4_ = fVar114 * (float)local_1540._4_4_ + fVar108 * fVar20 + fVar113 * fVar19
            ;
            auVar145._8_4_ = fVar114 * fStack_1538 + fVar108 * fVar28 + fVar113 * fVar27;
            auVar145._12_4_ = fVar114 * fStack_1534 + fVar108 * fVar36 + fVar113 * fVar35;
            auVar145._16_4_ = fVar114 * fStack_1530 + fVar108 * fVar44 + fVar113 * fVar43;
            auVar145._20_4_ = fVar114 * fStack_152c + fVar108 * fVar52 + fVar113 * fVar51;
            auVar145._24_4_ = fVar114 * fStack_1528 + fVar108 * fVar60 + fVar113 * fVar59;
            auVar145._28_4_ = fVar113 + fVar113 + fVar76;
            auVar136._8_4_ = 0x80000000;
            auVar136._0_8_ = 0x8000000080000000;
            auVar136._12_4_ = 0x80000000;
            auVar136._16_4_ = 0x80000000;
            auVar136._20_4_ = 0x80000000;
            auVar136._24_4_ = 0x80000000;
            auVar136._28_4_ = 0x80000000;
            auVar121 = vandps_avx(auVar145,auVar136);
            uVar98 = auVar121._0_4_;
            auVar159._0_4_ =
                 (float)(uVar98 ^ (uint)(fVar175 * auVar64._0_4_ +
                                        fVar192 * auVar65._0_4_ + fVar201 * auVar66._0_4_));
            uVar180 = auVar121._4_4_;
            auVar159._4_4_ =
                 (float)(uVar180 ^
                        (uint)(fVar179 * auVar64._4_4_ +
                              fVar195 * auVar65._4_4_ + fVar203 * auVar66._4_4_));
            uVar182 = auVar121._8_4_;
            auVar159._8_4_ =
                 (float)(uVar182 ^
                        (uint)(fVar181 * auVar64._8_4_ +
                              fVar196 * auVar65._8_4_ + fVar204 * auVar66._8_4_));
            uVar184 = auVar121._12_4_;
            auVar159._12_4_ =
                 (float)(uVar184 ^
                        (uint)(fVar183 * auVar64._12_4_ +
                              fVar197 * auVar65._12_4_ + fVar205 * auVar66._12_4_));
            uVar186 = auVar121._16_4_;
            auVar159._16_4_ =
                 (float)(uVar186 ^
                        (uint)(fVar185 * auVar64._16_4_ +
                              fVar198 * auVar65._16_4_ + fVar206 * auVar66._16_4_));
            uVar188 = auVar121._20_4_;
            auVar159._20_4_ =
                 (float)(uVar188 ^
                        (uint)(fVar187 * auVar64._20_4_ +
                              fVar199 * auVar65._20_4_ + fVar207 * auVar66._20_4_));
            uVar190 = auVar121._24_4_;
            auVar159._24_4_ =
                 (float)(uVar190 ^
                        (uint)(fVar189 * auVar64._24_4_ +
                              fVar200 * auVar65._24_4_ + fVar208 * auVar66._24_4_));
            uVar191 = auVar121._28_4_;
            auVar159._28_4_ =
                 (float)(uVar191 ^ (uint)(auVar126._28_4_ + auVar10._28_4_ + auVar61._28_4_));
            auVar173._0_4_ =
                 (float)(uVar98 ^ (uint)(auVar64._0_4_ * fVar119 +
                                        auVar65._0_4_ * fVar115 + fVar117 * auVar66._0_4_));
            auVar173._4_4_ =
                 (float)(uVar180 ^
                        (uint)(auVar64._4_4_ * fVar15 +
                              auVar65._4_4_ * fVar13 + fVar14 * auVar66._4_4_));
            auVar173._8_4_ =
                 (float)(uVar182 ^
                        (uint)(auVar64._8_4_ * fVar23 +
                              auVar65._8_4_ * fVar21 + fVar22 * auVar66._8_4_));
            auVar173._12_4_ =
                 (float)(uVar184 ^
                        (uint)(auVar64._12_4_ * fVar31 +
                              auVar65._12_4_ * fVar29 + fVar30 * auVar66._12_4_));
            auVar173._16_4_ =
                 (float)(uVar186 ^
                        (uint)(auVar64._16_4_ * fVar39 +
                              auVar65._16_4_ * fVar37 + fVar38 * auVar66._16_4_));
            auVar173._20_4_ =
                 (float)(uVar188 ^
                        (uint)(auVar64._20_4_ * fVar47 +
                              auVar65._20_4_ * fVar45 + fVar46 * auVar66._20_4_));
            auVar173._24_4_ =
                 (float)(uVar190 ^
                        (uint)(auVar64._24_4_ * fVar55 +
                              auVar65._24_4_ * fVar53 + fVar54 * auVar66._24_4_));
            auVar173._28_4_ =
                 (float)(uVar191 ^ (uint)(local_1540._28_4_ + auVar65._28_4_ + auVar66._28_4_));
            auVar126 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar121 = vcmpps_avx(auVar159,auVar126,5);
            auVar126 = vcmpps_avx(auVar173,auVar126,5);
            auVar121 = vandps_avx(auVar121,auVar126);
            auVar111._8_4_ = 0x7fffffff;
            auVar111._0_8_ = 0x7fffffff7fffffff;
            auVar111._12_4_ = 0x7fffffff;
            auVar111._16_4_ = 0x7fffffff;
            auVar111._20_4_ = 0x7fffffff;
            auVar111._24_4_ = 0x7fffffff;
            auVar111._28_4_ = 0x7fffffff;
            local_1320 = vandps_avx(auVar145,auVar111);
            auVar126 = vcmpps_avx(auVar145,ZEXT1232(ZEXT812(0)) << 0x20,4);
            auVar121 = vandps_avx(auVar121,auVar126);
            auVar137._0_4_ = auVar173._0_4_ + auVar159._0_4_;
            auVar137._4_4_ = auVar173._4_4_ + auVar159._4_4_;
            auVar137._8_4_ = auVar173._8_4_ + auVar159._8_4_;
            auVar137._12_4_ = auVar173._12_4_ + auVar159._12_4_;
            auVar137._16_4_ = auVar173._16_4_ + auVar159._16_4_;
            auVar137._20_4_ = auVar173._20_4_ + auVar159._20_4_;
            auVar137._24_4_ = auVar173._24_4_ + auVar159._24_4_;
            auVar137._28_4_ = auVar173._28_4_ + auVar159._28_4_;
            auVar10 = vcmpps_avx(auVar137,local_1320,2);
            auVar126 = vandps_avx(auVar121,auVar10);
            auVar61 = local_14e0 & auVar126;
            if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar61 >> 0x7f,0) != '\0') ||
                  (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar61 >> 0xbf,0) != '\0') ||
                (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar61[0x1f] < '\0') {
              auVar126 = vandps_avx(auVar126,local_14e0);
              local_1340._0_4_ =
                   (float)(uVar98 ^ (uint)((float)local_1540._0_4_ * fVar112 +
                                          fVar12 * fVar118 + fVar116 * fVar11));
              local_1340._4_4_ =
                   (float)(uVar180 ^
                          (uint)((float)local_1540._4_4_ * fVar18 +
                                fVar20 * fVar17 + fVar16 * fVar19));
              local_1340._8_4_ =
                   (float)(uVar182 ^
                          (uint)(fStack_1538 * fVar26 + fVar28 * fVar25 + fVar24 * fVar27));
              local_1340._12_4_ =
                   (float)(uVar184 ^
                          (uint)(fStack_1534 * fVar34 + fVar36 * fVar33 + fVar32 * fVar35));
              local_1340._16_4_ =
                   (float)(uVar186 ^
                          (uint)(fStack_1530 * fVar42 + fVar44 * fVar41 + fVar40 * fVar43));
              local_1340._20_4_ =
                   (float)(uVar188 ^
                          (uint)(fStack_152c * fVar50 + fVar52 * fVar49 + fVar48 * fVar51));
              local_1340._24_4_ =
                   (float)(uVar190 ^
                          (uint)(fStack_1528 * fVar58 + fVar60 * fVar57 + fVar56 * fVar59));
              local_1340._28_4_ =
                   uVar191 ^ (uint)(auVar63._28_4_ + auVar10._28_4_ + auVar121._28_4_);
              fVar108 = (ray->org).field_0.m128[3];
              fVar113 = local_1320._0_4_;
              fVar114 = local_1320._4_4_;
              auVar86._4_4_ = fVar114 * fVar108;
              auVar86._0_4_ = fVar113 * fVar108;
              fVar115 = local_1320._8_4_;
              auVar86._8_4_ = fVar115 * fVar108;
              fVar117 = local_1320._12_4_;
              auVar86._12_4_ = fVar117 * fVar108;
              fVar119 = local_1320._16_4_;
              auVar86._16_4_ = fVar119 * fVar108;
              fVar116 = local_1320._20_4_;
              auVar86._20_4_ = fVar116 * fVar108;
              fVar118 = local_1320._24_4_;
              auVar86._24_4_ = fVar118 * fVar108;
              auVar86._28_4_ = fVar108;
              auVar121 = vcmpps_avx(auVar86,local_1340,1);
              fVar108 = ray->tfar;
              auVar87._4_4_ = fVar114 * fVar108;
              auVar87._0_4_ = fVar113 * fVar108;
              auVar87._8_4_ = fVar115 * fVar108;
              auVar87._12_4_ = fVar117 * fVar108;
              auVar87._16_4_ = fVar119 * fVar108;
              auVar87._20_4_ = fVar116 * fVar108;
              auVar87._24_4_ = fVar118 * fVar108;
              auVar87._28_4_ = fVar108;
              auVar10 = vcmpps_avx(local_1340,auVar87,2);
              auVar121 = vandps_avx(auVar10,auVar121);
              auVar10 = auVar126 & auVar121;
              if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar10 >> 0x7f,0) != '\0') ||
                    (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0xbf,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar10[0x1f] < '\0') {
                auVar3._0_4_ = ray->tfar;
                auVar3._4_4_ = ray->mask;
                auVar3._8_4_ = ray->id;
                auVar3._12_4_ = ray->flags;
                local_12e0 = vandps_avx(auVar126,auVar121);
                uVar98 = vextractps_avx(auVar3,1);
                auVar121 = vsubps_avx(local_1320,auVar173);
                auVar121 = vblendvps_avx(auVar159,auVar121,local_1480);
                auVar10 = vsubps_avx(local_1320,auVar159);
                auVar126 = vblendvps_avx(auVar173,auVar10,local_1480);
                uStack_1244 = auVar10._28_4_;
                local_1260[0] = (float)local_1540._0_4_ * (float)local_14a0._0_4_;
                local_1260[1] = (float)local_1540._4_4_ * (float)local_14a0._4_4_;
                local_1260[2] = fStack_1538 * fStack_1498;
                local_1260[3] = fStack_1534 * fStack_1494;
                fStack_1250 = fStack_1530 * fStack_1490;
                fStack_124c = fStack_152c * fStack_148c;
                fStack_1248 = fStack_1528 * fStack_1488;
                local_1240[0] = fVar12 * (float)local_14a0._0_4_;
                local_1240[1] = fVar20 * (float)local_14a0._4_4_;
                local_1240[2] = fVar28 * fStack_1498;
                local_1240[3] = fVar36 * fStack_1494;
                fStack_1230 = fVar44 * fStack_1490;
                fStack_122c = fVar52 * fStack_148c;
                fStack_1228 = fVar60 * fStack_1488;
                uStack_1224 = uStack_1244;
                local_1220[0] = (float)local_14a0._0_4_ * fVar11;
                local_1220[1] = (float)local_14a0._4_4_ * fVar19;
                local_1220[2] = fStack_1498 * fVar27;
                local_1220[3] = fStack_1494 * fVar35;
                fStack_1210 = fStack_1490 * fVar43;
                fStack_120c = fStack_148c * fVar51;
                fStack_1208 = fStack_1488 * fVar59;
                uStack_1204 = uStack_1244;
                auVar141 = vpshufd_avx(ZEXT416(uVar102),0);
                auVar141 = vpaddd_avx(auVar141,_DAT_01f76ad0);
                auVar109 = vpshufd_avx(ZEXT416(uVar104),0);
                auVar140._0_4_ = (float)(int)(*(ushort *)(lVar91 + 8 + lVar95) - 1);
                auVar140._4_12_ = auVar64._4_12_;
                auVar109 = vpaddd_avx(auVar109,_DAT_01f76ae0);
                auVar147 = vrcpss_avx(auVar140,auVar140);
                auVar176._0_4_ = (float)(int)(*(ushort *)(lVar91 + 10 + lVar95) - 1);
                auVar176._4_12_ = auVar64._4_12_;
                auVar131 = vrcpss_avx(auVar176,auVar176);
                auVar130._16_16_ = auVar141;
                auVar130._0_16_ = auVar141;
                auVar10 = vcvtdq2ps_avx(auVar130);
                auVar141 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - auVar147._0_4_ * auVar140._0_4_)))
                ;
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                local_1380 = (fVar113 * auVar10._0_4_ + auVar121._0_4_) * auVar141._0_4_;
                fStack_137c = (fVar114 * auVar10._4_4_ + auVar121._4_4_) * auVar141._4_4_;
                fStack_1378 = (fVar115 * auVar10._8_4_ + auVar121._8_4_) * auVar141._8_4_;
                fStack_1374 = (fVar117 * auVar10._12_4_ + auVar121._12_4_) * auVar141._12_4_;
                fStack_1370 = (fVar119 * auVar10._16_4_ + auVar121._16_4_) * auVar141._0_4_;
                fStack_136c = (fVar116 * auVar10._20_4_ + auVar121._20_4_) * auVar141._4_4_;
                fStack_1368 = (fVar118 * auVar10._24_4_ + auVar121._24_4_) * auVar141._8_4_;
                fStack_1364 = auVar10._28_4_ + auVar121._28_4_;
                auVar138._16_16_ = auVar109;
                auVar138._0_16_ = auVar109;
                auVar121 = vcvtdq2ps_avx(auVar138);
                auVar141 = ZEXT416((uint)(auVar131._0_4_ * (2.0 - auVar131._0_4_ * auVar176._0_4_)))
                ;
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                local_1360 = (fVar113 * auVar121._0_4_ + auVar126._0_4_) * auVar141._0_4_;
                fStack_135c = (fVar114 * auVar121._4_4_ + auVar126._4_4_) * auVar141._4_4_;
                fStack_1358 = (fVar115 * auVar121._8_4_ + auVar126._8_4_) * auVar141._8_4_;
                fStack_1354 = (fVar117 * auVar121._12_4_ + auVar126._12_4_) * auVar141._12_4_;
                fStack_1350 = (fVar119 * auVar121._16_4_ + auVar126._16_4_) * auVar141._0_4_;
                fStack_134c = (fVar116 * auVar121._20_4_ + auVar126._20_4_) * auVar141._4_4_;
                fStack_1348 = (fVar118 * auVar121._24_4_ + auVar126._24_4_) * auVar141._8_4_;
                fStack_1344 = auVar121._28_4_ + auVar126._28_4_;
                if ((local_1560->mask & uVar98) != 0) {
                  pRVar9 = context->args;
                  if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                     (local_1560->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00e8111f:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  auStack_1558 = auVar62._8_24_;
                  auVar121 = vrcpps_avx(local_1320);
                  fVar108 = auVar121._0_4_;
                  fVar112 = auVar121._4_4_;
                  auVar88._4_4_ = fVar114 * fVar112;
                  auVar88._0_4_ = fVar113 * fVar108;
                  fVar113 = auVar121._8_4_;
                  auVar88._8_4_ = fVar115 * fVar113;
                  fVar114 = auVar121._12_4_;
                  auVar88._12_4_ = fVar117 * fVar114;
                  fVar115 = auVar121._16_4_;
                  auVar88._16_4_ = fVar119 * fVar115;
                  fVar117 = auVar121._20_4_;
                  auVar88._20_4_ = fVar116 * fVar117;
                  fVar119 = auVar121._24_4_;
                  auVar88._24_4_ = fVar118 * fVar119;
                  auVar88._28_4_ = local_1320._28_4_;
                  auVar160._8_4_ = 0x3f800000;
                  auVar160._0_8_ = 0x3f8000003f800000;
                  auVar160._12_4_ = 0x3f800000;
                  auVar160._16_4_ = 0x3f800000;
                  auVar160._20_4_ = 0x3f800000;
                  auVar160._24_4_ = 0x3f800000;
                  auVar160._28_4_ = 0x3f800000;
                  auVar126 = vsubps_avx(auVar160,auVar88);
                  fVar108 = fVar108 + fVar108 * auVar126._0_4_;
                  fVar112 = fVar112 + fVar112 * auVar126._4_4_;
                  fVar113 = fVar113 + fVar113 * auVar126._8_4_;
                  fVar114 = fVar114 + fVar114 * auVar126._12_4_;
                  fVar115 = fVar115 + fVar115 * auVar126._16_4_;
                  fVar117 = fVar117 + fVar117 * auVar126._20_4_;
                  fVar119 = fVar119 + fVar119 * auVar126._24_4_;
                  local_1280[0] = fVar108 * local_1340._0_4_;
                  local_1280[1] = fVar112 * local_1340._4_4_;
                  local_1280[2] = fVar113 * local_1340._8_4_;
                  local_1280[3] = fVar114 * local_1340._12_4_;
                  fStack_1270 = fVar115 * local_1340._16_4_;
                  fStack_126c = fVar117 * local_1340._20_4_;
                  fStack_1268 = fVar119 * local_1340._24_4_;
                  uStack_1264 = local_1340._28_4_;
                  local_12c0[0] = local_1380 * fVar108;
                  local_12c0[1] = fStack_137c * fVar112;
                  local_12c0[2] = fStack_1378 * fVar113;
                  local_12c0[3] = fStack_1374 * fVar114;
                  fStack_12b0 = fStack_1370 * fVar115;
                  fStack_12ac = fStack_136c * fVar117;
                  fStack_12a8 = fStack_1368 * fVar119;
                  uStack_12a4 = local_1340._28_4_;
                  local_12a0[0] = local_1360 * fVar108;
                  local_12a0[1] = fStack_135c * fVar112;
                  local_12a0[2] = fStack_1358 * fVar113;
                  local_12a0[3] = fStack_1354 * fVar114;
                  fStack_1290 = fStack_1350 * fVar115;
                  fStack_128c = fStack_134c * fVar117;
                  fStack_1288 = fStack_1348 * fVar119;
                  fStack_1284 = auVar121._28_4_ + auVar126._28_4_;
                  uVar96 = vmovmskps_avx(local_12e0);
                  uVar93 = CONCAT44((int)((ulong)context >> 0x20),uVar96);
                  lVar91 = 0;
                  _local_1540 = auVar67;
                  if (uVar93 != 0) {
                    for (; (uVar93 >> lVar91 & 1) == 0; lVar91 = lVar91 + 1) {
                    }
                  }
                  while( true ) {
                    local_1500._0_8_ = uVar93;
                    if (uVar93 == 0) break;
                    local_15b4 = local_12c0[lVar91];
                    local_15b0 = local_12a0[lVar91];
                    local_1540._0_4_ = ray->tfar;
                    ray->tfar = local_1280[lVar91];
                    local_1590.context = context->user;
                    local_15c0 = local_1260[lVar91];
                    local_15bc = local_1240[lVar91];
                    local_1520._0_8_ = lVar91;
                    local_15b8 = local_1220[lVar91];
                    local_15a4 = (local_1590.context)->instID[0];
                    local_15a0 = (local_1590.context)->instPrimID[0];
                    local_164c = -1;
                    local_1590.valid = &local_164c;
                    local_1590.geometryUserPtr = *(void **)((long)local_1560 + 0x18);
                    local_1590.hit = (RTCHitN *)&local_15c0;
                    local_1590.N = 1;
                    local_15ac = uVar6;
                    local_15a8 = uVar89;
                    local_1590.ray = (RTCRayN *)ray;
                    if (((*(code **)((long)local_1560 + 0x48) == (code *)0x0) ||
                        ((**(code **)((long)local_1560 + 0x48))(&local_1590), *local_1590.valid != 0
                        )) && ((pRVar9->filter == (RTCFilterFunctionN)0x0 ||
                               ((((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                                  RTC_RAY_QUERY_FLAG_INCOHERENT &&
                                 ((*(byte *)((long)local_1560 + 0x3e) & 0x40) == 0)) ||
                                ((*pRVar9->filter)(&local_1590), *local_1590.valid != 0))))))
                    goto LAB_00e8111f;
                    ray->tfar = (float)local_1540._0_4_;
                    uVar93 = local_1500._0_8_ ^ 1L << (local_1520._0_8_ & 0x3f);
                    lVar91 = 0;
                    if (uVar93 != 0) {
                      for (; (uVar93 >> lVar91 & 1) == 0; lVar91 = lVar91 + 1) {
                      }
                    }
                  }
                }
              }
            }
            auVar212 = ZEXT3264(local_13a0);
            uVar93 = local_15d0;
            uVar99 = local_15d8;
            uVar100 = local_15e0;
            uVar101 = local_15e8;
            uVar103 = local_15f0;
            uVar107 = local_15f8;
          }
          auVar161 = ZEXT3264(local_13c0);
          auVar170 = ZEXT3264(local_13e0);
          auVar146 = ZEXT3264(local_1400);
          auVar194 = ZEXT3264(local_1420);
          auVar178 = ZEXT3264(local_1440);
          auVar154 = ZEXT3264(local_1460);
          pRVar97 = (Ray *)0x0;
        }
        goto LAB_00e805e1;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }